

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_ThresholdDouble
          (ThresholdDoubleForm2 Threshold,string *namespaceName,uint32_t size)

{
  uchar uVar1;
  uchar uVar2;
  uint32_t uVar3;
  reference pvVar4;
  reference pvVar5;
  undefined8 in_RSI;
  code *in_RDI;
  pair<double,_double> pVar6;
  uint32_t i;
  TimerContainer timer;
  uint8_t maxThreshold;
  uint8_t minThreshold;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer *in_stack_ffffffffffffff50;
  TimerContainer *in_stack_ffffffffffffff60;
  uint local_7c;
  BaseTimerContainer *in_stack_ffffffffffffffb0;
  TimerContainer local_40;
  code *pcVar7;
  
  Test_Helper::uniformImages
            ((uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,(uint32_t)((ulong)in_RSI >> 0x20));
  uVar1 = Test_Helper::randomValue<unsigned_char>(0x175120);
  uVar2 = Test_Helper::randomValue<unsigned_char>
                    ((uchar)((ulong)in_stack_ffffffffffffff50 >> 0x30),
                     (uint32_t)in_stack_ffffffffffffff50);
  SetupFunction((string *)0x175158);
  Performance_Test::TimerContainer::TimerContainer(in_stack_ffffffffffffff50);
  local_7c = 0;
  while( true ) {
    uVar3 = Test_Helper::runCount();
    if (uVar3 <= local_7c) break;
    Performance_Test::TimerContainer::start(in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff60 = &local_40;
    pcVar7 = in_RDI;
    pvVar4 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)in_stack_ffffffffffffff60,0);
    pvVar5 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           *)in_stack_ffffffffffffff60,1);
    (*in_RDI)(pvVar4,pvVar5,uVar1,uVar2);
    Performance_Test::TimerContainer::stop(in_stack_ffffffffffffff60);
    local_7c = local_7c + 1;
    in_RDI = pcVar7;
  }
  CleanupFunction((string *)0x175244);
  pVar6 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffffb0);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x175286);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_ffffffffffffff60);
  return pVar6;
}

Assistant:

std::pair < double, double > template_ThresholdDouble( ThresholdDoubleForm2 Threshold, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 2, size, size );
        uint8_t minThreshold = Performance_Test::randomValue<uint8_t>( 256 );
        uint8_t maxThreshold = Performance_Test::randomValue<uint8_t>( minThreshold, 256 );

        TEST_FUNCTION_LOOP( Threshold( image[0], image[1], minThreshold, maxThreshold ), namespaceName )
    }